

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O3

void test_union_intersection(void)

{
  uint64_t *puVar1;
  _Bool _Var2;
  bitset_t *pbVar3;
  bitset_t *pbVar4;
  size_t sVar5;
  bitset_t *pbVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint64_t uVar10;
  long lVar11;
  int k;
  ulong uVar12;
  size_t shiftedi;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  ulong auStack_130 [5];
  bitset_t *pbStack_108;
  bitset_t *pbStack_100;
  code *pcStack_f8;
  bitset_t *pbStack_e8;
  undefined8 uStack_e0;
  bitset_t *pbStack_d8;
  code *pcStack_d0;
  bitset_t *pbStack_c0;
  bitset_t *pbStack_b8;
  bitset_t *pbStack_b0;
  ulong uStack_a8;
  ulong uStack_a0;
  bitset_t *pbStack_98;
  code *pcStack_90;
  bitset_t *pbStack_88;
  long lStack_80;
  ulong uStack_78;
  bitset_t *pbStack_70;
  code *pcStack_68;
  bitset_t *pbStack_58;
  ulong uStack_50;
  ulong uStack_48;
  bitset_t *pbStack_40;
  long lStack_38;
  
  pbVar3 = bitset_create();
  lVar15 = 0;
  pbVar4 = bitset_create();
  uVar12 = 0;
  do {
    uVar13 = uVar12 >> 5;
    if ((uVar13 < pbVar3->arraysize) || (_Var2 = bitset_grow(pbVar3,uVar13 + 1), _Var2)) {
      pbVar3->array[uVar13] = pbVar3->array[uVar13] | 1L << ((byte)lVar15 & 0x3e);
    }
    if ((uVar13 < pbVar4->arraysize) || (_Var2 = bitset_grow(pbVar4,uVar13 + 1), _Var2)) {
      pbVar4->array[uVar13] = pbVar4->array[uVar13] | 2L << ((byte)lVar15 & 0x3e);
    }
    uVar12 = uVar12 + 1;
    lVar15 = lVar15 + 2;
  } while (uVar12 != 1000);
  bitset_inplace_symmetric_difference(pbVar3,pbVar4);
  sVar5 = bitset_count(pbVar3);
  if (sVar5 == 2000) {
    bitset_inplace_symmetric_difference(pbVar3,pbVar4);
    sVar5 = bitset_count(pbVar3);
    if (sVar5 != 1000) goto LAB_00102002;
    bitset_inplace_difference(pbVar3,pbVar4);
    sVar5 = bitset_count(pbVar3);
    if (sVar5 != 1000) goto LAB_00102007;
    bitset_inplace_union(pbVar3,pbVar4);
    sVar5 = bitset_count(pbVar3);
    if (sVar5 != 2000) goto LAB_0010200c;
    bitset_inplace_intersection(pbVar3,pbVar4);
    sVar5 = bitset_count(pbVar3);
    if (sVar5 != 1000) goto LAB_00102011;
    bitset_inplace_difference(pbVar3,pbVar4);
    sVar5 = bitset_count(pbVar3);
    if (sVar5 != 0) goto LAB_00102016;
    bitset_inplace_union(pbVar3,pbVar4);
    bitset_inplace_difference(pbVar4,pbVar3);
    sVar5 = bitset_count(pbVar4);
    if (sVar5 == 0) {
      bitset_free(pbVar3);
      bitset_free(pbVar4);
      return;
    }
  }
  else {
    test_union_intersection_cold_1();
LAB_00102002:
    test_union_intersection_cold_2();
LAB_00102007:
    test_union_intersection_cold_3();
LAB_0010200c:
    test_union_intersection_cold_4();
LAB_00102011:
    test_union_intersection_cold_5();
LAB_00102016:
    test_union_intersection_cold_6();
  }
  test_union_intersection_cold_7();
  pcStack_68 = (code *)0x102030;
  pbStack_58 = pbVar3;
  uStack_50 = uVar12;
  uStack_48 = uVar13;
  pbStack_40 = pbVar4;
  lStack_38 = lVar15;
  pbVar3 = bitset_create();
  lVar15 = 0;
  pcStack_68 = (code *)0x10203b;
  pbVar4 = bitset_create();
  uVar13 = 0;
  uVar12 = 0;
  do {
    uVar7 = uVar12 >> 5;
    if (uVar7 < pbVar3->arraysize) {
LAB_00102061:
      pbVar3->array[uVar7] = pbVar3->array[uVar7] | 1L << ((byte)lVar15 & 0x3e);
    }
    else {
      pcStack_68 = (code *)0x10205d;
      _Var2 = bitset_grow(pbVar3,uVar7 + 1);
      if (_Var2) goto LAB_00102061;
    }
    uVar7 = uVar13 >> 6;
    if (uVar7 < pbVar4->arraysize) {
LAB_00102093:
      pbVar4->array[uVar7] = pbVar4->array[uVar7] | 1L << ((byte)uVar13 & 0x3f);
    }
    else {
      pcStack_68 = (code *)0x10208f;
      _Var2 = bitset_grow(pbVar4,uVar7 + 1);
      if (_Var2) goto LAB_00102093;
    }
    uVar12 = uVar12 + 1;
    uVar13 = uVar13 + 3;
    lVar15 = lVar15 + 2;
  } while (uVar12 != 1000);
  pcStack_68 = (code *)0x1020c4;
  sVar5 = bitset_intersection_count(pbVar3,pbVar4);
  if (sVar5 == 0x14e) {
    pcStack_68 = (code *)0x1020d7;
    sVar5 = bitset_union_count(pbVar3,pbVar4);
    if (sVar5 == 0x682) {
      pcStack_68 = (code *)0x1020e7;
      bitset_free(pbVar3);
      bitset_free(pbVar4);
      return;
    }
  }
  else {
    pcStack_68 = (code *)0x102102;
    test_counts_cold_1();
  }
  pcStack_68 = test_disjoint;
  test_counts_cold_2();
  pcStack_90 = (code *)0x102115;
  pbStack_88 = pbVar3;
  lStack_80 = lVar15;
  uStack_78 = uVar12;
  pbStack_70 = pbVar4;
  pcStack_68 = (code *)uVar13;
  pbVar3 = bitset_create();
  uVar12 = 0;
  pcStack_90 = (code *)0x102120;
  pbVar4 = bitset_create();
  do {
    uVar13 = uVar12 >> 6;
    if ((uVar12 & 1) == 0) {
      uVar7 = 0x3e;
      pbVar6 = pbVar3;
      if (uVar13 < pbVar3->arraysize) goto LAB_00102176;
      pcStack_90 = (code *)0x10215e;
      _Var2 = bitset_grow(pbVar3,uVar13 + 1);
LAB_00102172:
      if (_Var2 != false) goto LAB_00102176;
    }
    else {
      uVar7 = 0x3f;
      pbVar6 = pbVar4;
      if (pbVar4->arraysize <= uVar13) {
        pcStack_90 = (code *)0x10216f;
        _Var2 = bitset_grow(pbVar4,uVar13 + 1);
        goto LAB_00102172;
      }
LAB_00102176:
      uVar14 = (uint)uVar7 & (uint)uVar12;
      uVar7 = (ulong)uVar14;
      pbVar6->array[uVar13] = pbVar6->array[uVar13] | 1L << (sbyte)uVar14;
    }
    uVar12 = uVar12 + 1;
  } while (uVar12 != 1000);
  pcStack_90 = (code *)0x1021a2;
  _Var2 = bitsets_disjoint(pbVar3,pbVar4);
  if (_Var2) {
    uVar7 = 0x20000000000000;
    if (pbVar3->arraysize < 8) {
      pcStack_90 = (code *)0x1021c4;
      _Var2 = bitset_grow(pbVar3,8);
      if (_Var2) goto LAB_001021c8;
    }
    else {
LAB_001021c8:
      pbVar3->array[7] = pbVar3->array[7] | 0x20000000000000;
    }
    if (pbVar4->arraysize < 8) {
      pcStack_90 = (code *)0x1021e3;
      _Var2 = bitset_grow(pbVar4,8);
      if (_Var2) goto LAB_001021e7;
    }
    else {
LAB_001021e7:
      pbVar4->array[7] = pbVar4->array[7] | 0x20000000000000;
    }
    pcStack_90 = (code *)0x1021f9;
    _Var2 = bitsets_disjoint(pbVar3,pbVar4);
    if (!_Var2) {
      pcStack_90 = (code *)0x102205;
      bitset_free(pbVar3);
      bitset_free(pbVar4);
      return;
    }
  }
  else {
    pcStack_90 = (code *)0x10221b;
    test_disjoint_cold_1();
  }
  pcStack_90 = test_intersects;
  test_disjoint_cold_2();
  pbStack_b8 = (bitset_t *)0x10222e;
  pbStack_b0 = pbVar3;
  uStack_a8 = uVar12;
  uStack_a0 = uVar13;
  pbStack_98 = pbVar4;
  pcStack_90 = (code *)uVar7;
  pbVar3 = bitset_create();
  pbStack_b8 = (bitset_t *)0x102236;
  pbVar4 = bitset_create();
  pbStack_b8 = (bitset_t *)0x102241;
  _Var2 = bitset_empty(pbVar3);
  if (_Var2) {
    uVar12 = 0;
    do {
      uVar13 = uVar12 >> 6;
      if ((uVar12 & 1) == 0) {
        uVar7 = 0x3e;
        pbVar6 = pbVar3;
        if (uVar13 < pbVar3->arraysize) goto LAB_0010229f;
        pbStack_b8 = (bitset_t *)0x102287;
        _Var2 = bitset_grow(pbVar3,uVar13 + 1);
LAB_0010229b:
        if (_Var2 != false) goto LAB_0010229f;
      }
      else {
        uVar7 = 0x3f;
        pbVar6 = pbVar4;
        if (pbVar4->arraysize <= uVar13) {
          pbStack_b8 = (bitset_t *)0x102298;
          _Var2 = bitset_grow(pbVar4,uVar13 + 1);
          goto LAB_0010229b;
        }
LAB_0010229f:
        uVar14 = (uint)uVar7 & (uint)uVar12;
        uVar7 = (ulong)uVar14;
        pbVar6->array[uVar13] = pbVar6->array[uVar13] | 1L << (sbyte)uVar14;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != 1000);
    pbStack_b8 = (bitset_t *)0x1022cb;
    _Var2 = bitsets_intersect(pbVar3,pbVar4);
    if (_Var2) goto LAB_00102344;
    uVar7 = 0x20000000000;
    if (pbVar3->arraysize < 0x10) {
      pbStack_b8 = (bitset_t *)0x1022ed;
      _Var2 = bitset_grow(pbVar3,0x10);
      if (_Var2) goto LAB_001022f1;
    }
    else {
LAB_001022f1:
      pbVar3->array[0xf] = pbVar3->array[0xf] | 0x20000000000;
    }
    if (pbVar4->arraysize < 0x10) {
      pbStack_b8 = (bitset_t *)0x10230c;
      _Var2 = bitset_grow(pbVar4,0x10);
      if (_Var2) goto LAB_00102310;
    }
    else {
LAB_00102310:
      pbVar4->array[0xf] = pbVar4->array[0xf] | 0x20000000000;
    }
    pbStack_b8 = (bitset_t *)0x102322;
    _Var2 = bitsets_intersect(pbVar3,pbVar4);
    if (_Var2) {
      pbStack_b8 = (bitset_t *)0x10232e;
      bitset_free(pbVar3);
      bitset_free(pbVar4);
      return;
    }
  }
  else {
    pbStack_b8 = (bitset_t *)0x102344;
    test_intersects_cold_1();
LAB_00102344:
    pbStack_b8 = (bitset_t *)0x102349;
    test_intersects_cold_3();
  }
  pbStack_b8 = (bitset_t *)test_contains_all_different_sizes;
  test_intersects_cold_2();
  pcStack_d0 = (code *)0x10235c;
  pbStack_c0 = pbVar3;
  pbStack_b8 = pbVar4;
  pbVar3 = bitset_create_with_capacity(10);
  pcStack_d0 = (code *)0x102369;
  pbVar4 = bitset_create_with_capacity(5);
  if (pbVar3->arraysize == 0) {
    pcStack_d0 = (code *)0x102380;
    _Var2 = bitset_grow(pbVar3,1);
    if (_Var2) goto LAB_00102384;
  }
  else {
LAB_00102384:
    *pbVar3->array = *pbVar3->array | 2;
  }
  if (pbVar3->arraysize == 0) {
    pcStack_d0 = (code *)0x10239f;
    _Var2 = bitset_grow(pbVar3,1);
    if (_Var2) goto LAB_001023a3;
  }
  else {
LAB_001023a3:
    *pbVar3->array = *pbVar3->array | 0x10;
  }
  if (pbVar3->arraysize == 0) {
    pcStack_d0 = (code *)0x1023be;
    _Var2 = bitset_grow(pbVar3,1);
    if (_Var2) goto LAB_001023c2;
  }
  else {
LAB_001023c2:
    *pbVar3->array = *pbVar3->array | 0x40;
  }
  if (pbVar4->arraysize == 0) {
    pcStack_d0 = (code *)0x1023dd;
    _Var2 = bitset_grow(pbVar4,1);
    if (_Var2) goto LAB_001023e1;
  }
  else {
LAB_001023e1:
    *pbVar4->array = *pbVar4->array | 2;
  }
  if (pbVar4->arraysize == 0) {
    pcStack_d0 = (code *)0x1023fc;
    _Var2 = bitset_grow(pbVar4,1);
    if (_Var2) goto LAB_00102400;
  }
  else {
LAB_00102400:
    *pbVar4->array = *pbVar4->array | 0x10;
  }
  pcStack_d0 = (code *)0x102412;
  _Var2 = bitset_contains_all(pbVar3,pbVar4);
  if (_Var2) {
    pcStack_d0 = (code *)0x102421;
    _Var2 = bitset_contains_all(pbVar4,pbVar3);
    if (!_Var2) {
      pcStack_d0 = (code *)0x10242d;
      bitset_free(pbVar3);
      bitset_free(pbVar4);
      return;
    }
  }
  else {
    pcStack_d0 = (code *)0x102441;
    test_contains_all_different_sizes_cold_1();
  }
  pcStack_d0 = test_contains_all;
  test_contains_all_different_sizes_cold_2();
  pcStack_f8 = (code *)0x102453;
  pbStack_e8 = pbVar3;
  uStack_e0 = 1000;
  pbStack_d8 = pbVar4;
  pcStack_d0 = (code *)uVar7;
  pbVar3 = bitset_create();
  uVar12 = 0;
  pcStack_f8 = (code *)0x10245e;
  pbVar4 = bitset_create();
  do {
    uVar13 = uVar12 >> 6;
    if (uVar13 < pbVar3->arraysize) {
LAB_0010247f:
      pbVar3->array[uVar13] = pbVar3->array[uVar13] | 1L << ((byte)uVar12 & 0x3f);
    }
    else {
      pcStack_f8 = (code *)0x10247b;
      _Var2 = bitset_grow(pbVar3,uVar13 + 1);
      if (_Var2) goto LAB_0010247f;
    }
    if ((uVar12 & 1) == 0) {
      if (pbVar4->arraysize <= uVar13) {
        pcStack_f8 = (code *)0x1024aa;
        _Var2 = bitset_grow(pbVar4,uVar13 + 1);
        if (!_Var2) goto LAB_001024c3;
      }
      pbVar4->array[uVar13] = pbVar4->array[uVar13] | 1L << ((byte)uVar12 & 0x3e);
    }
LAB_001024c3:
    uVar12 = uVar12 + 1;
  } while (uVar12 != 1000);
  pcStack_f8 = (code *)0x1024da;
  _Var2 = bitset_contains_all(pbVar3,pbVar4);
  if (_Var2) {
    pcStack_f8 = (code *)0x1024e9;
    _Var2 = bitset_contains_all(pbVar4,pbVar3);
    if (_Var2) goto LAB_00102554;
    if (pbVar4->arraysize < 0x10) {
      pcStack_f8 = (code *)0x102501;
      _Var2 = bitset_grow(pbVar4,0x10);
      if (_Var2) goto LAB_00102505;
    }
    else {
LAB_00102505:
      pbVar4->array[0xf] = pbVar4->array[0xf] | 0x20000000000;
    }
    pcStack_f8 = (code *)0x102521;
    _Var2 = bitset_contains_all(pbVar3,pbVar4);
    if (!_Var2) {
      pcStack_f8 = (code *)0x102530;
      _Var2 = bitset_contains_all(pbVar4,pbVar3);
      if (!_Var2) {
        pcStack_f8 = (code *)0x10253c;
        bitset_free(pbVar3);
        bitset_free(pbVar4);
        return;
      }
      goto LAB_0010255e;
    }
  }
  else {
    pcStack_f8 = (code *)0x102554;
    test_contains_all_cold_1();
LAB_00102554:
    pcStack_f8 = (code *)0x102559;
    test_contains_all_cold_4();
  }
  pcStack_f8 = (code *)0x10255e;
  test_contains_all_cold_3();
LAB_0010255e:
  pcStack_f8 = test_next_bits_iterate;
  test_contains_all_cold_2();
  uVar13 = 0;
  pbStack_108 = pbVar3;
  pbStack_100 = pbVar4;
  pcStack_f8 = (code *)uVar12;
  pbVar3 = bitset_create();
  do {
    uVar12 = uVar13 >> 6;
    if (uVar12 < pbVar3->arraysize) {
LAB_00102594:
      pbVar3->array[uVar12] = pbVar3->array[uVar12] | 1L << ((byte)uVar13 & 0x3f);
    }
    else {
      _Var2 = bitset_grow(pbVar3,uVar12 + 1);
      if (_Var2) goto LAB_00102594;
    }
    uVar13 = uVar13 + 1;
  } while (uVar13 != 100);
  uVar12 = 0x3e6;
  do {
    uVar12 = uVar12 + 2;
    uVar13 = uVar12 >> 6;
    if (uVar13 < pbVar3->arraysize) {
LAB_001025d6:
      pbVar3->array[uVar13] = pbVar3->array[uVar13] | 1L << ((byte)uVar12 & 0x3e);
    }
    else {
      _Var2 = bitset_grow(pbVar3,uVar13 + 1);
      if (_Var2) goto LAB_001025d6;
    }
  } while (uVar12 < 0x44a);
  uVar12 = pbVar3->arraysize;
  if (uVar12 != 0) {
    puVar1 = pbVar3->array;
    uVar7 = 0;
    uVar13 = 0;
    lVar15 = 0;
    do {
      uVar10 = (puVar1[uVar7] >> ((byte)uVar13 & 0x3f)) << ((byte)uVar13 & 0x3f);
      uVar13 = uVar13 & 0xffffffffffffffc0;
      uVar8 = 0;
      do {
        while (uVar10 == 0) {
          uVar7 = uVar7 + 1;
          if (uVar7 == uVar12) {
            lVar11 = lVar15;
            if (uVar8 == 0) goto LAB_001026ac;
            goto LAB_0010265a;
          }
          uVar13 = uVar13 + 0x40;
          uVar10 = puVar1[uVar7];
          if (2 < uVar8) goto LAB_0010265a;
        }
        uVar9 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
          }
        }
        auStack_130[uVar8 + 1] = uVar9 | uVar13;
        uVar8 = uVar8 + 1;
        uVar10 = uVar10 & uVar10 - 1;
      } while (uVar8 != 3);
      uVar8 = 3;
LAB_0010265a:
      lVar11 = lVar15 + uVar8;
      uVar13 = lVar15 * 2 + 800;
      uVar7 = 0;
      do {
        uVar9 = lVar15 + uVar7;
        if (99 < lVar15 + uVar7) {
          uVar9 = uVar13;
        }
        if (auStack_130[uVar7 + 1] != uVar9) {
          test_next_bits_iterate_cold_1();
          goto LAB_001026ce;
        }
        uVar7 = uVar7 + 1;
        uVar13 = uVar13 + 2;
      } while (uVar8 != uVar7);
      uVar13 = auStack_130[uVar8] + 1;
      uVar7 = uVar13 >> 6;
      lVar15 = lVar11;
    } while (uVar7 < uVar12);
LAB_001026ac:
    if (lVar11 == 0x96) {
      bitset_free(pbVar3);
      return;
    }
  }
LAB_001026ce:
  test_next_bits_iterate_cold_2();
  uVar12 = 0;
  pbVar3 = bitset_create();
  do {
    uVar13 = uVar12 >> 6;
    if ((uVar13 < pbVar3->arraysize) || (_Var2 = bitset_grow(pbVar3,uVar13 + 1), _Var2)) {
      pbVar3->array[uVar13] = pbVar3->array[uVar13] | 1L << ((byte)uVar12 & 0x3f);
    }
    uVar12 = uVar12 + 1;
  } while (uVar12 != 100);
  uVar12 = 0x3e6;
  do {
    uVar12 = uVar12 + 2;
    uVar13 = uVar12 >> 6;
    if ((uVar13 < pbVar3->arraysize) || (_Var2 = bitset_grow(pbVar3,uVar13 + 1), _Var2)) {
      pbVar3->array[uVar13] = pbVar3->array[uVar13] | 1L << ((byte)uVar12 & 0x3e);
    }
  } while (uVar12 < 0x44a);
  uVar12 = pbVar3->arraysize;
  if (uVar12 != 0) {
    uVar8 = 0;
    uVar7 = 0;
    uVar13 = 0;
    do {
      uVar9 = pbVar3->array[uVar8] >> ((byte)uVar13 & 0x3f);
      if (uVar9 == 0) {
        lVar15 = uVar8 * -0x40;
        do {
          uVar8 = uVar8 + 1;
          if (uVar12 == uVar8) goto LAB_001027db;
          uVar13 = pbVar3->array[uVar8];
          lVar15 = lVar15 + -0x40;
        } while (uVar13 == 0);
        lVar11 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
          }
        }
        uVar13 = lVar11 - lVar15;
      }
      else {
        lVar15 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
          }
        }
        uVar13 = uVar13 + lVar15;
      }
      uVar8 = uVar7 * 2 + 800;
      if (uVar7 < 100) {
        uVar8 = uVar7;
      }
      if (uVar13 != uVar8) {
        test_next_bit_iterate_cold_1();
        goto LAB_001027f9;
      }
      uVar7 = uVar7 + 1;
      uVar13 = uVar13 + 1;
      uVar8 = uVar13 >> 6;
    } while (uVar8 < uVar12);
LAB_001027db:
    if (uVar7 == 0x96) {
      bitset_free(pbVar3);
      return;
    }
  }
LAB_001027f9:
  test_next_bit_iterate_cold_2();
  test_next_bit_iterate();
  test_next_bits_iterate();
  test_set_to_val();
  test_construct();
  test_union_intersection();
  test_iterate();
  test_iterate2();
  test_max_min();
  test_counts();
  test_shift_right();
  test_shift_left();
  test_disjoint();
  test_intersects();
  test_contains_all();
  test_contains_all_different_sizes();
  puts("All TEST_ASSERTs passed. Code is probably ok.");
  return;
}

Assistant:

void test_union_intersection() {
  bitset_t *b1 = bitset_create();
  bitset_t *b2 = bitset_create();

  for (int k = 0; k < 1000; ++k) {
    bitset_set(b1, 2 * k);
    bitset_set(b2, 2 * k + 1);
  }
  // calling xor twice should leave things unchanged
  bitset_inplace_symmetric_difference(b1, b2);
  TEST_ASSERT(bitset_count(b1) == 2000);
  bitset_inplace_symmetric_difference(b1, b2);
  TEST_ASSERT(bitset_count(b1) == 1000);
  bitset_inplace_difference(b1, b2); // should make no difference
  TEST_ASSERT(bitset_count(b1) == 1000);
  bitset_inplace_union(b1, b2);
  TEST_ASSERT(bitset_count(b1) == 2000);
  bitset_inplace_intersection(b1, b2);
  TEST_ASSERT(bitset_count(b1) == 1000);
  bitset_inplace_difference(b1, b2);
  TEST_ASSERT(bitset_count(b1) == 0);
  bitset_inplace_union(b1, b2);
  bitset_inplace_difference(b2, b1);
  TEST_ASSERT(bitset_count(b2) == 0);
  bitset_free(b1);
  bitset_free(b2);
}